

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamedResult.cpp
# Opt level: O2

string * __thiscall
oout::NamedResult::print_abi_cxx11_(string *__return_storage_ptr__,NamedResult *this,Format *format)

{
  element_type *peVar1;
  undefined1 auStack_48 [48];
  
  peVar1 = (this->result).super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  FmtNamed::FmtNamed((FmtNamed *)auStack_48,format,&this->name);
  (*peVar1->_vptr_Result[2])(__return_storage_ptr__,peVar1,auStack_48);
  std::__cxx11::string::~string((string *)(auStack_48 + 0x10));
  return __return_storage_ptr__;
}

Assistant:

string NamedResult::print(const Format &format) const
{
	return result->print(FmtNamed(&format, name));
}